

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,OplsTorsionType *ott)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"This OplsTorsionType has below form:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(ott->v1_);
  poVar1 = std::operator<<(poVar1,"/2*(1+cos(phi))");
  std::operator<<(poVar1," + ");
  poVar1 = std::ostream::_M_insert<double>(ott->v2_);
  poVar1 = std::operator<<(poVar1,"/2*(1-cos(2*phi))");
  std::operator<<(poVar1," + ");
  poVar1 = std::ostream::_M_insert<double>(ott->v3_);
  poVar1 = std::operator<<(poVar1,"/2*(1+cos(3*phi))");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, OplsTorsionType& ott) {
    os << "This OplsTorsionType has below form:" << std::endl;
    os << ott.v1_ << "/2*(1+cos(phi))"
       << " + " << ott.v2_ << "/2*(1-cos(2*phi))"
       << " + " << ott.v3_ << "/2*(1+cos(3*phi))" << std::endl;
    return os;
  }